

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rect nk_shrink_rect(nk_rect r,float amount)

{
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  nk_rect nVar4;
  
  nVar4.x = r.x + amount;
  nVar4.y = r.y + amount;
  fVar1 = amount + amount;
  auVar2._4_4_ = fVar1;
  auVar2._0_4_ = fVar1;
  auVar2._8_4_ = fVar1;
  auVar2._12_4_ = fVar1;
  auVar3._8_4_ = in_XMM1_Dc;
  auVar3._0_8_ = r._8_8_;
  auVar3._12_4_ = in_XMM1_Dd;
  auVar3 = maxps(auVar2,auVar3);
  nVar4.h = auVar3._4_4_ - fVar1;
  nVar4.w = auVar3._0_4_ - fVar1;
  return nVar4;
}

Assistant:

NK_INTERN struct nk_rect
nk_shrink_rect(struct nk_rect r, float amount)
{
    struct nk_rect res;
    r.w = NK_MAX(r.w, 2 * amount);
    r.h = NK_MAX(r.h, 2 * amount);
    res.x = r.x + amount;
    res.y = r.y + amount;
    res.w = r.w - 2 * amount;
    res.h = r.h - 2 * amount;
    return res;
}